

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stripctrl.c
# Opt level: O0

void stripctrl_locale_BinarySink_write(BinarySink *bs,void *vp,size_t len)

{
  char *pcVar1;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var2;
  ulong uVar3;
  StripCtrlChars *pSVar4;
  size_t consumed_1;
  size_t consumed_from_main_string;
  size_t consumed;
  size_t to_copy;
  char *previous_locale;
  char *p;
  StripCtrlCharsImpl *scc;
  StripCtrlChars *sccpub;
  size_t len_local;
  void *vp_local;
  BinarySink *bs_local;
  
  pcVar1 = setlocale(0,(char *)0x0);
  pcVar1 = dupstr(pcVar1);
  setlocale(0,"");
  do {
    previous_locale = (char *)vp;
    sccpub = (StripCtrlChars *)len;
    if (bs[-3].writefmtv == (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0) {
LAB_0011d40e:
      while ((sccpub != (StripCtrlChars *)0x0 &&
             (pSVar4 = (StripCtrlChars *)
                       stripctrl_locale_try_consume
                                 ((StripCtrlCharsImpl *)&bs[-7].binarysink_,previous_locale,
                                  (size_t)sccpub), pSVar4 != (StripCtrlChars *)0x0))) {
        if (sccpub < pSVar4) {
          __assert_fail("consumed <= len",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/stripctrl.c"
                        ,0x17b,
                        "void stripctrl_locale_BinarySink_write(BinarySink *, const void *, size_t)"
                       );
        }
        previous_locale = previous_locale + (long)pSVar4->binarysink_;
        sccpub = (StripCtrlChars *)((long)sccpub - (long)pSVar4);
      }
      if ((StripCtrlChars *)0x40 < sccpub) {
        __assert_fail("len <= SCC_BUFSIZE",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/stripctrl.c"
                      ,0x184,
                      "void stripctrl_locale_BinarySink_write(BinarySink *, const void *, size_t)");
      }
      memcpy(&bs[-6].binarysink_,previous_locale,(size_t)sccpub);
      bs[-3].writefmtv = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)sccpub;
LAB_0011d4c4:
      setlocale(0,pcVar1);
      safefree(pcVar1);
      return;
    }
    consumed = 0x40 - (long)bs[-3].writefmtv;
    if (len < consumed) {
      consumed = len;
    }
    memcpy((_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)
           ((long)&bs[-6].binarysink_ + (long)bs[-3].writefmtv),vp,consumed);
    p_Var2 = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)
             stripctrl_locale_try_consume
                       ((StripCtrlCharsImpl *)&bs[-7].binarysink_,(char *)&bs[-6].binarysink_,
                        (size_t)(bs[-3].writefmtv + consumed));
    if (bs[-3].writefmtv <= p_Var2) {
      uVar3 = (long)p_Var2 - (long)bs[-3].writefmtv;
      if (len < uVar3) {
        __assert_fail("consumed_from_main_string <= len",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/stripctrl.c"
                      ,0x14d,
                      "void stripctrl_locale_BinarySink_write(BinarySink *, const void *, size_t)");
      }
      previous_locale = (char *)(uVar3 + (long)vp);
      sccpub = (StripCtrlChars *)(len - uVar3);
      bs[-3].writefmtv = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0;
      goto LAB_0011d40e;
    }
    if (p_Var2 == (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0) {
      if (consumed != len) {
        __assert_fail("to_copy == len",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/stripctrl.c"
                      ,0x15f,
                      "void stripctrl_locale_BinarySink_write(BinarySink *, const void *, size_t)");
      }
      bs[-3].writefmtv = bs[-3].writefmtv + consumed;
      goto LAB_0011d4c4;
    }
    bs[-3].writefmtv = bs[-3].writefmtv + -(long)p_Var2;
    memmove(&bs[-6].binarysink_,
            (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)
            ((long)&bs[-6].binarysink_ + (long)p_Var2),(size_t)bs[-3].writefmtv);
  } while( true );
}

Assistant:

static void stripctrl_locale_BinarySink_write(
    BinarySink *bs, const void *vp, size_t len)
{
    StripCtrlChars *sccpub = BinarySink_DOWNCAST(bs, StripCtrlChars);
    StripCtrlCharsImpl *scc =
        container_of(sccpub, StripCtrlCharsImpl, public);
    const char *p = (const char *)vp;

    char *previous_locale = dupstr(setlocale(LC_CTYPE, NULL));
    setlocale(LC_CTYPE, "");

    /*
     * Deal with any partial multibyte character buffered from last
     * time.
     */
    while (scc->buflen > 0) {
        size_t to_copy = SCC_BUFSIZE - scc->buflen;
        if (to_copy > len)
            to_copy = len;

        memcpy(scc->buf + scc->buflen, p, to_copy);
        size_t consumed = stripctrl_locale_try_consume(
            scc, scc->buf, scc->buflen + to_copy);

        if (consumed >= scc->buflen) {
            /*
             * We've consumed a multibyte character that includes all
             * the data buffered from last time. So we can clear our
             * buffer and move on to processing the main input string
             * in situ, having first discarded whatever initial
             * segment of it completed our previous character.
             */
            size_t consumed_from_main_string = consumed - scc->buflen;
            assert(consumed_from_main_string <= len);
            p += consumed_from_main_string;
            len -= consumed_from_main_string;
            scc->buflen = 0;
            break;
        }

        if (consumed == 0) {
            /*
             * If we didn't manage to consume anything, i.e. the whole
             * buffer contains an incomplete sequence, it had better
             * be because our entire input string _this_ time plus
             * whatever leftover data we had from _last_ time still
             * comes to less than SCC_BUFSIZE. In other words, we've
             * already copied all the new data on to the end of our
             * buffer, and it still hasn't helped. So increment buflen
             * to reflect the new data, and return.
             */
            assert(to_copy == len);
            scc->buflen += to_copy;
            goto out;
        }

        /*
         * Otherwise, we've somehow consumed _less_ data than we had
         * buffered, and yet we weren't able to consume that data in
         * the last call to this function. That sounds impossible, but
         * I can think of one situation in which it could happen: if
         * we had an incomplete MB sequence last time, and now more
         * data has arrived, it turns out to be an _illegal_ one, so
         * we consume one byte in the hope of resynchronising.
         *
         * Anyway, in this case we move the buffer up and go back
         * round this initial loop.
         */
        scc->buflen -= consumed;
        memmove(scc->buf, scc->buf + consumed, scc->buflen);
    }

    /*
     * Now charge along the main string.
     */
    while (len > 0) {
        size_t consumed = stripctrl_locale_try_consume(scc, p, len);
        if (consumed == 0)
            break;
        assert(consumed <= len);
        p += consumed;
        len -= consumed;
    }

    /*
     * Any data remaining should be copied into our buffer, to keep
     * for next time.
     */
    assert(len <= SCC_BUFSIZE);
    memcpy(scc->buf, p, len);
    scc->buflen = len;

  out:
    setlocale(LC_CTYPE, previous_locale);
    sfree(previous_locale);
}